

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ExpNode * __thiscall Parser::ExprOrAUX(Parser *this,ExpNode *expr)

{
  uint uVar1;
  TokenNode *this_00;
  ExpNode *exp2;
  BooleanOPNode *this_01;
  
  if (this->tok == 0x32) {
    Eat(this,0x32);
    this_00 = (TokenNode *)operator_new(0x40);
    TokenNode::TokenNode(this_00,0x32,(char *)0x0);
    uVar1 = lexical_analyzer_getLine();
    (*(this_00->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])(this_00,(ulong)uVar1);
    exp2 = ExprOr(this);
    this_01 = (BooleanOPNode *)operator_new(0x50);
    BooleanOPNode::BooleanOPNode(this_01,this_00,expr,exp2);
    uVar1 = lexical_analyzer_getLine();
    (*(this_01->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])(this_01,(ulong)uVar1);
    (this_01->super_ExpNode).type = 8;
    expr = (ExpNode *)this_01;
  }
  return &((BooleanOPNode *)expr)->super_ExpNode;
}

Assistant:

ExpNode *Parser::ExprOrAUX(ExpNode *expr) {
    TokenNode *token = nullptr;
    ExpNode *exp2 = nullptr;
    ExpNode *node = expr;
    switch (tok) {
        case OR: {
            Eat(OR);

            token = new TokenNode(OR, nullptr);
            token->setLine(lexical_analyzer_getLine());

            exp2 = ExprOr();

            node = new BooleanOPNode(token, expr, exp2);
            node->setLine(lexical_analyzer_getLine());
            node->setType(BOOL);

            break;
        }
    }
    return node;
}